

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getopt_pp.h
# Opt level: O2

Result GetOpt::convert<int>(string *s,int *result,fmtflags flags)

{
  uint uVar1;
  Result RVar2;
  stringstream ss;
  ostream local_198 [8];
  fmtflags afStack_190 [92];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  std::ios::clear((int)&ss + (int)*(undefined8 *)(_ss + -0x18));
  *(fmtflags *)((long)afStack_190 + *(long *)(_ss + -0x18)) = flags;
  std::operator<<(local_198,(string *)s);
  std::istream::operator>>((istream *)&ss,result);
  uVar1 = *(uint *)((long)afStack_190 + *(long *)(_ss + -0x18) + 8);
  RVar2 = BadType;
  if ((uVar1 & 5) == 0) {
    RVar2 = (uint)((uVar1 & 2) == 0) * 3;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return RVar2;
}

Assistant:

inline _Option::Result convert(const std::string& s, T& result, std::ios::fmtflags flags)
{
    std::stringstream ss;
    ss.clear();
    ss.flags(flags);
    ss << s;
    ss >> result;
    if (ss.fail() || !ss.eof())
        return _Option::BadType;
    else
        return _Option::OK;
}